

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

WhereTerm * findTerm(WhereClause *pWC,int iCur,int iColumn,Bitmask notReady,u32 op,Index *pIdx)

{
  WhereClause **ppWVar1;
  char cVar2;
  byte bVar3;
  Parse *pParse;
  char cVar4;
  uchar *b;
  Expr *pEVar5;
  CollSeq *pCVar6;
  byte *pbVar7;
  ulong uVar8;
  long lVar9;
  WhereClause *pWVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  WhereTerm *pWVar14;
  byte *pbVar15;
  WhereTerm *pWVar16;
  int iVar17;
  uint uVar18;
  int aEquiv [22];
  int local_88 [22];
  
  local_88[0] = iCur;
  local_88[1] = iColumn;
  uVar18 = 2;
  lVar9 = 2;
  pWVar14 = (WhereTerm *)0x0;
  iVar11 = iColumn;
  do {
    pWVar10 = pWC;
    if (pWC != (WhereClause *)0x0) {
      do {
        iVar17 = pWVar10->nTerm;
        if (iVar17 != 0) {
          pWVar16 = pWVar10->a;
          do {
            if ((pWVar16->leftCursor != iCur) || ((pWVar16->u).leftColumn != iVar11))
            goto LAB_00197fe9;
            uVar8 = pWVar16->prereqRight;
            if (((uVar8 & notReady) == 0) && ((op & 0xfff & (uint)pWVar16->eOperator) != 0)) {
              if ((char)pWVar16->eOperator < '\0' || (pIdx == (Index *)0x0 || iColumn < 0)) {
LAB_001980e6:
                if ((uVar8 == 0) && ((pWVar16->eOperator & 2) != 0)) {
                  return pWVar16;
                }
                if (pWVar14 == (WhereTerm *)0x0) {
                  pWVar14 = pWVar16;
                }
                goto LAB_00197ee2;
              }
              pEVar5 = pWVar16->pExpr;
              pParse = pWVar10->pParse;
              cVar2 = pIdx->pTable->aCol[(uint)iColumn].affinity;
              cVar4 = comparisonAffinity(pEVar5);
              if (cVar4 == 'a') {
                if (cVar2 == 'a') goto LAB_00198002;
              }
              else if ((cVar4 == 'b') || ('b' < cVar2)) {
LAB_00198002:
                pCVar6 = sqlite3BinaryCompareCollSeq(pParse,pEVar5->pLeft,pEVar5->pRight);
                if (pCVar6 == (CollSeq *)0x0) {
                  pCVar6 = pParse->db->pDfltColl;
                }
                if (*pIdx->aiColumn == iColumn) {
                  uVar13 = 0;
                }
                else {
                  uVar8 = 0;
                  do {
                    if (pIdx->nColumn == uVar8) {
                      return (WhereTerm *)0x0;
                    }
                    uVar13 = uVar8 + 1;
                    lVar12 = uVar8 + 1;
                    uVar8 = uVar13;
                  } while (pIdx->aiColumn[lVar12] != iColumn);
                }
                pbVar15 = (byte *)pCVar6->zName;
                pbVar7 = (byte *)pIdx->azColl[uVar13];
                bVar3 = *pbVar15;
                if (bVar3 == 0) {
                  uVar8 = 0;
                }
                else {
                  do {
                    uVar8 = (ulong)bVar3;
                    pbVar15 = pbVar15 + 1;
                    if (""[uVar8] != ""[*pbVar7]) goto LAB_001980c6;
                    pbVar7 = pbVar7 + 1;
                    bVar3 = *pbVar15;
                  } while (bVar3 != 0);
                  uVar8 = 0;
                }
LAB_001980c6:
                if (""[uVar8] == ""[*pbVar7]) {
                  uVar8 = pWVar16->prereqRight;
                  goto LAB_001980e6;
                }
              }
            }
            else {
LAB_00197ee2:
              if (((int)uVar18 < 0x16 & *(byte *)((long)&pWVar16->eOperator + 1) >> 2) == 1) {
                for (pEVar5 = pWVar16->pExpr->pRight; pEVar5 != (Expr *)0x0; pEVar5 = pEVar5->pLeft)
                {
                  if ((pEVar5->op != '\\') && (pEVar5->op != '\x18')) goto LAB_00197fa7;
                }
                pEVar5 = (Expr *)0x0;
LAB_00197fa7:
                if ((int)uVar18 < 1) {
                  lVar12 = 0;
                }
                else {
                  lVar12 = 0;
                  do {
                    if ((local_88[lVar12] == pEVar5->iTable) &&
                       (local_88[lVar12 + 1] == (int)pEVar5->iColumn)) break;
                    lVar12 = lVar12 + 2;
                  } while ((int)lVar12 < (int)uVar18);
                }
                if ((uint)lVar12 == uVar18) {
                  local_88[uVar18] = pEVar5->iTable;
                  local_88[(ulong)uVar18 + 1] = (int)pEVar5->iColumn;
                  uVar18 = uVar18 + 2;
                }
              }
            }
LAB_00197fe9:
            pWVar16 = pWVar16 + 1;
            iVar17 = iVar17 + -1;
          } while (iVar17 != 0);
        }
        ppWVar1 = &pWVar10->pOuter;
        pWVar10 = *ppWVar1;
      } while (*ppWVar1 != (WhereClause *)0x0);
    }
    if ((int)uVar18 <= lVar9) {
      return pWVar14;
    }
    iCur = local_88[lVar9];
    iVar11 = local_88[lVar9 + 1];
    lVar9 = lVar9 + 2;
  } while( true );
}

Assistant:

static WhereTerm *findTerm(
  WhereClause *pWC,     /* The WHERE clause to be searched */
  int iCur,             /* Cursor number of LHS */
  int iColumn,          /* Column number of LHS */
  Bitmask notReady,     /* RHS must not overlap with this mask */
  u32 op,               /* Mask of WO_xx values describing operator */
  Index *pIdx           /* Must be compatible with this index, if not NULL */
){
  WhereTerm *pTerm;            /* Term being examined as possible result */
  WhereTerm *pResult = 0;      /* The answer to return */
  WhereClause *pWCOrig = pWC;  /* Original pWC value */
  int j, k;                    /* Loop counters */
  Expr *pX;                /* Pointer to an expression */
  Parse *pParse;           /* Parsing context */
  int iOrigCol = iColumn;  /* Original value of iColumn */
  int nEquiv = 2;          /* Number of entires in aEquiv[] */
  int iEquiv = 2;          /* Number of entries of aEquiv[] processed so far */
  int aEquiv[22];          /* iCur,iColumn and up to 10 other equivalents */

  assert( iCur>=0 );
  aEquiv[0] = iCur;
  aEquiv[1] = iColumn;
  for(;;){
    for(pWC=pWCOrig; pWC; pWC=pWC->pOuter){
      for(pTerm=pWC->a, k=pWC->nTerm; k; k--, pTerm++){
        if( pTerm->leftCursor==iCur
          && pTerm->u.leftColumn==iColumn
        ){
          if( (pTerm->prereqRight & notReady)==0
           && (pTerm->eOperator & op & WO_ALL)!=0
          ){
            if( iOrigCol>=0 && pIdx && (pTerm->eOperator & WO_ISNULL)==0 ){
              CollSeq *pColl;
              char idxaff;
      
              pX = pTerm->pExpr;
              pParse = pWC->pParse;
              idxaff = pIdx->pTable->aCol[iOrigCol].affinity;
              if( !sqlite3IndexAffinityOk(pX, idxaff) ){
                continue;
              }
      
              /* Figure out the collation sequence required from an index for
              ** it to be useful for optimising expression pX. Store this
              ** value in variable pColl.
              */
              assert(pX->pLeft);
              pColl = sqlite3BinaryCompareCollSeq(pParse,pX->pLeft,pX->pRight);
              if( pColl==0 ) pColl = pParse->db->pDfltColl;
      
              for(j=0; pIdx->aiColumn[j]!=iOrigCol; j++){
                if( NEVER(j>=pIdx->nColumn) ) return 0;
              }
              if( sqlite3StrICmp(pColl->zName, pIdx->azColl[j]) ){
                continue;
              }
            }
            if( pTerm->prereqRight==0 && (pTerm->eOperator&WO_EQ)!=0 ){
              pResult = pTerm;
              goto findTerm_success;
            }else if( pResult==0 ){
              pResult = pTerm;
            }
          }
          if( (pTerm->eOperator & WO_EQUIV)!=0
           && nEquiv<ArraySize(aEquiv)
          ){
            pX = sqlite3ExprSkipCollate(pTerm->pExpr->pRight);
            assert( pX->op==TK_COLUMN );
            for(j=0; j<nEquiv; j+=2){
              if( aEquiv[j]==pX->iTable && aEquiv[j+1]==pX->iColumn ) break;
            }
            if( j==nEquiv ){
              aEquiv[j] = pX->iTable;
              aEquiv[j+1] = pX->iColumn;
              nEquiv += 2;
            }
          }
        }
      }
    }
    if( iEquiv>=nEquiv ) break;
    iCur = aEquiv[iEquiv++];
    iColumn = aEquiv[iEquiv++];
  }
findTerm_success:
  return pResult;
}